

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory.cc
# Opt level: O0

void __thiscall Ellipse::Ellipse(Ellipse *this)

{
  Ellipse *this_local;
  
  Shape::Shape(&this->super_Shape);
  std::__cxx11::string::operator=((string *)this,"ellipse");
  return;
}

Assistant:

Ellipse() {
    value = "ellipse";
  }